

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTRawBufferCopyAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  EventKind EVar1;
  uint32 uVar2;
  TTDVar pvVar3;
  
  if (evt->EventKind == RawBufferCopySync) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar3;
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
    evt[1].EventTimeStamp = (int64)pvVar3;
    EVar1 = FileReader::ReadUInt32(reader,u32Val,true);
    evt[2].EventKind = EVar1;
    uVar2 = FileReader::ReadUInt32(reader,u32Val,true);
    evt[2].ResultStatus = uVar2;
    uVar2 = FileReader::ReadUInt32(reader,u32Val,true);
    *(uint32 *)&evt[2].EventTimeStamp = uVar2;
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTRawBufferCopyAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTRawBufferCopyAction* rbcAction = GetInlineEventDataAs<JsRTRawBufferCopyAction, EventKind::RawBufferCopySync>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            rbcAction->Dst = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            rbcAction->Src = NSSnapValues::ParseTTDVar(false, reader);

            rbcAction->DstIndx = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            rbcAction->SrcIndx = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            rbcAction->Count = reader->ReadUInt32(NSTokens::Key::u32Val, true);
        }